

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::throw_or_mimic<cxxopts::exceptions::option_already_exists>(string *text)

{
  option_already_exists *this;
  string *text_local;
  
  this = (option_already_exists *)__cxa_allocate_exception(0x28);
  exceptions::option_already_exists::option_already_exists(this,text);
  __cxa_throw(this,&exceptions::option_already_exists::typeinfo,
              exceptions::option_already_exists::~option_already_exists);
}

Assistant:

void throw_or_mimic(const std::string& text)
{
  static_assert(std::is_base_of<std::exception, T>::value,
                "throw_or_mimic only works on std::exception and "
                "deriving classes");

#ifndef CXXOPTS_NO_EXCEPTIONS
  // If CXXOPTS_NO_EXCEPTIONS is not defined, just throw
  throw T{text};
#else
  // Otherwise manually instantiate the exception, print what() to stderr,
  // and exit
  T exception{text};
  std::cerr << exception.what() << std::endl;
  std::exit(EXIT_FAILURE);
#endif
}